

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_transaction_common.cpp
# Opt level: O0

SignParameter * __thiscall
cfd::SignParameter::operator=(SignParameter *this,SignParameter *sign_parameter)

{
  bool bVar1;
  SignDataType SVar2;
  SignParameter *in_RSI;
  SignParameter *in_RDI;
  SignParameter *this_00;
  ByteData *in_stack_ffffffffffffff50;
  Pubkey *pPVar3;
  ScriptOperator local_80;
  SigHashType local_4c;
  Pubkey local_40;
  undefined1 local_28 [40];
  
  if (in_RDI != in_RSI) {
    this_00 = (SignParameter *)local_28;
    local_28._24_8_ = in_RSI;
    GetData(this_00);
    core::ByteData::operator=(in_stack_ffffffffffffff50,&this_00->data_);
    core::ByteData::~ByteData((ByteData *)0x50aec2);
    SVar2 = GetDataType((SignParameter *)local_28._24_8_);
    in_RDI->data_type_ = SVar2;
    pPVar3 = &local_40;
    GetRelatedPubkey(this_00);
    core::Pubkey::operator=(&in_RDI->related_pubkey_,pPVar3);
    core::Pubkey::~Pubkey((Pubkey *)0x50af0d);
    bVar1 = IsDerEncode((SignParameter *)local_28._24_8_);
    in_RDI->der_encode_ = bVar1;
    GetSigHashType(this_00);
    core::SigHashType::operator=(&in_RDI->sighash_type_,&local_4c);
    GetOpCode(this_00);
    core::ScriptOperator::operator=(&in_RDI->op_code_,&local_80);
    core::ScriptOperator::~ScriptOperator((ScriptOperator *)0x50af84);
  }
  return in_RDI;
}

Assistant:

SignParameter& SignParameter::operator=(const SignParameter& sign_parameter) {
  if (this != &sign_parameter) {
    data_ = sign_parameter.GetData();
    data_type_ = sign_parameter.GetDataType();
    related_pubkey_ = sign_parameter.GetRelatedPubkey();
    der_encode_ = sign_parameter.IsDerEncode();
    sighash_type_ = sign_parameter.GetSigHashType();
    op_code_ = sign_parameter.GetOpCode();
  }
  return *this;
}